

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O3

void __thiscall
QGestureManager::getGestureTargets
          (QGestureManager *this,QSet<QGesture_*> *gestures,
          QHash<QWidget_*,_QList<QGesture_*>_> *conflicts,
          QHash<QWidget_*,_QList<QGesture_*>_> *normal)

{
  Span **ppSVar1;
  byte bVar2;
  Entry *pEVar3;
  GestureType GVar4;
  const_iterator cVar5;
  long lVar6;
  ulong uVar7;
  Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *pDVar8;
  ulong uVar9;
  long lVar10;
  const_iterator cVar11;
  QHash<QWidget_*,_QList<QGesture_*>_> *this_00;
  Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *pDVar12;
  QWidget *pQVar13;
  QObject *pQVar14;
  ulong uVar15;
  long lVar16;
  QPodArrayOps<QGesture*> *this_01;
  Data *pDVar17;
  ulong uVar18;
  long lVar19;
  long in_FS_OFFSET;
  QWidget *widget;
  QGesture *gesture;
  QWidget *local_78;
  undefined8 uStack_70;
  QPointer<QWidget> local_60;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.wp.value = (QObject *)0x0;
  pDVar17 = (gestures->q_hash).d;
  if (pDVar17 == (Data *)0x0) {
    pDVar17 = (Data *)0x0;
    uVar18 = 0;
LAB_002d6dee:
    uVar15 = 0;
    pQVar14 = (QObject *)0x0;
    if (uVar18 != 0 || pDVar17 != (Data *)0x0) goto LAB_002d6e03;
LAB_002d6fcb:
    if (pQVar14 == (QObject *)0x0 && uVar15 == 0) goto LAB_002d723e;
  }
  else {
    if (pDVar17->spans->offsets[0] == 0xff) {
      uVar15 = 1;
      do {
        uVar18 = uVar15;
        if (pDVar17->numBuckets == uVar18) {
          pDVar17 = (Data *)0x0;
          uVar18 = 0;
          break;
        }
        uVar15 = uVar18 + 1;
      } while (pDVar17->spans[uVar18 >> 7].offsets[(uint)uVar18 & 0x7f] == 0xff);
      goto LAB_002d6dee;
    }
    uVar18 = 0;
LAB_002d6e03:
    do {
      local_60.wp.d =
           *(Data **)pDVar17->spans[uVar18 >> 7].entries
                     [pDVar17->spans[uVar18 >> 7].offsets[(uint)uVar18 & 0x7f]].storage.data;
      local_78 = (QWidget *)0x0;
      uStack_70 = 0;
      QHash<QGesture_*,_QPointer<QWidget>_>::value
                ((QHash<QGesture_*,_QPointer<QWidget>_> *)&local_50,(QGesture **)(this + 0x40),
                 &local_60);
      if (local_50.iterator.i.d == (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0)
      {
        pDVar8 = (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0;
      }
      else {
        pDVar8 = (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)
                 local_50.iterator.i.bucket;
        if (*(int *)&(local_50.iterator.i.d)->field_0x4 == 0) {
          pDVar8 = (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0;
        }
        LOCK();
        ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          pDVar12 = local_50.iterator.i.d;
          if (local_50.iterator.i.d ==
              (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0) {
            pDVar12 = (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0;
          }
          operator_delete(pDVar12);
        }
      }
      if (local_78 != (QWidget *)0x0) {
        LOCK();
        *(int *)local_78 = *(int *)local_78 + -1;
        UNLOCK();
        if (*(int *)local_78 == 0) {
          pQVar13 = local_78;
          if (local_78 == (QWidget *)0x0) {
            pQVar13 = (QWidget *)0x0;
          }
          operator_delete(pQVar13);
        }
      }
      if (pDVar8 != (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0) {
        GVar4 = QGesture::gestureType((QGesture *)local_60.wp.d);
        local_78 = (QWidget *)CONCAT44(local_78._4_4_,GVar4);
        QHash<Qt::GestureType,QHash<QWidget*,QGesture*>>::tryEmplace_impl<Qt::GestureType_const&>
                  ((TryEmplaceResult *)&local_50,&local_60.wp.value,(GestureType *)&local_78);
        ppSVar1 = &(local_50.iterator.i.d)->spans;
        local_50.iterator.i.d = pDVar8;
        QHash<QWidget*,QGesture*>::emplace<QGesture*const&>
                  ((QHash<QWidget*,QGesture*> *)
                   ((((*ppSVar1)[local_50.iterator.i.bucket >> 7].entries)->storage).data +
                   (ulong)(*ppSVar1)[local_50.iterator.i.bucket >> 7].offsets
                          [(uint)local_50.iterator.i.bucket & 0x7f] * 0x10 + 8),
                   (QWidget **)&local_50,(QGesture **)&local_60);
      }
      do {
        if (pDVar17->numBuckets - 1 == uVar18) {
          uVar18 = 0;
          pDVar17 = (Data *)0x0;
          break;
        }
        uVar18 = uVar18 + 1;
      } while (pDVar17->spans[uVar18 >> 7].offsets[(uint)uVar18 & 0x7f] == 0xff);
    } while ((uVar18 != 0) || (pDVar17 != (Data *)0x0));
    if (local_60.wp.value == (QObject *)0x0) {
      uVar15 = 0;
      pQVar14 = (QObject *)0x0;
      goto LAB_002d6fcb;
    }
    pQVar14 = local_60.wp.value;
    if (**(char **)(local_60.wp.value + 0x20) == -1) {
      uVar18 = 1;
      do {
        uVar15 = uVar18;
        if (*(ulong *)(local_60.wp.value + 0x10) == uVar15) {
          pQVar14 = (QObject *)0x0;
          uVar15 = 0;
          break;
        }
        uVar18 = uVar15 + 1;
      } while ((*(char **)(local_60.wp.value + 0x20))
               [(ulong)((uint)uVar15 & 0x7f) + (uVar15 >> 7) * 0x90] == -1);
      goto LAB_002d6fcb;
    }
    uVar15 = 0;
  }
  do {
    lVar16 = (uVar15 >> 7) * 0x90;
    uVar18 = (ulong)((uint)uVar15 & 0x7f);
    lVar19 = *(long *)(*(long *)(*(long *)(pQVar14 + 0x20) + 0x80 + lVar16) + 8 +
                      (ulong)*(byte *)(uVar18 + *(long *)(pQVar14 + 0x20) + lVar16) * 0x10);
    if (lVar19 == 0) {
LAB_002d7059:
      lVar19 = 0;
      uVar9 = 0;
LAB_002d705e:
      if (lVar19 != 0 || uVar9 != 0) goto LAB_002d706a;
    }
    else {
      if (**(char **)(lVar19 + 0x20) == -1) {
        uVar7 = 1;
        do {
          uVar9 = uVar7;
          if (*(ulong *)(lVar19 + 0x10) == uVar9) goto LAB_002d7059;
          uVar7 = uVar9 + 1;
        } while ((*(char **)(lVar19 + 0x20))[(ulong)((uint)uVar9 & 0x7f) + (uVar9 >> 7) * 0x90] ==
                 -1);
        goto LAB_002d705e;
      }
      uVar9 = 0;
LAB_002d706a:
      do {
        lVar10 = (uVar9 >> 7) * 0x90;
        uVar7 = (ulong)((uint)uVar9 & 0x7f);
        local_78 = *(QWidget **)
                    (*(long *)(*(long *)(lVar19 + 0x20) + 0x80 + lVar10) +
                    (ulong)*(byte *)(uVar7 + *(long *)(lVar19 + 0x20) + lVar10) * 0x10);
        lVar6 = *(long *)&local_78->field_0x8;
        while (pQVar13 = *(QWidget **)(lVar6 + 0x10), this_00 = normal, pQVar13 != (QWidget *)0x0) {
          cVar5 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::find
                            ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                             (*(long *)&pQVar13->field_0x8 + 0x238),
                             (GestureType *)
                             ((ulong)*(byte *)(uVar18 + *(long *)(pQVar14 + 0x20) + lVar16) * 0x10 +
                             *(long *)(*(long *)(pQVar14 + 0x20) + 0x80 + lVar16)));
          lVar6 = *(long *)&pQVar13->field_0x8;
          cVar11._M_node = (_Base_ptr)(*(long *)(lVar6 + 0x238) + 0x10);
          if (*(long *)(lVar6 + 0x238) == 0) {
            cVar11._M_node = (_Base_ptr)0x0;
          }
          if ((((cVar5.i._M_node != (const_iterator)cVar11._M_node) &&
               ((*(byte *)((long)cVar5.i._M_node + 0x24) & 1) == 0)) &&
              (this_00 = conflicts, pQVar13 != local_78)) ||
             (this_00 = normal,
             ((pQVar13->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) break;
        }
        QHash<QWidget*,QList<QGesture*>>::tryEmplace_impl<QWidget*const&>
                  (&local_50,this_00,&local_78);
        pEVar3 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
        bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                [(uint)local_50.iterator.i.bucket & 0x7f];
        this_01 = (QPodArrayOps<QGesture*> *)(pEVar3[bVar2].storage.data + 8);
        local_50.iterator.i.d =
             *(Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> **)
              (*(long *)(*(long *)(lVar19 + 0x20) + 0x80 + lVar10) + 8 +
              (ulong)*(byte *)(uVar7 + *(long *)(lVar19 + 0x20) + lVar10) * 0x10);
        QtPrivate::QPodArrayOps<QGesture*>::emplace<QGesture*&>
                  (this_01,*(qsizetype *)(pEVar3[bVar2].storage.data + 0x18),(QGesture **)&local_50)
        ;
        QList<QGesture_*>::end((QList<QGesture_*> *)this_01);
        do {
          if (*(long *)(lVar19 + 0x10) - 1U == uVar9) {
            lVar19 = 0;
            uVar9 = 0;
            break;
          }
          uVar9 = uVar9 + 1;
        } while (*(char *)((ulong)((uint)uVar9 & 0x7f) +
                          (uVar9 >> 7) * 0x90 + *(long *)(lVar19 + 0x20)) == -1);
      } while ((lVar19 != 0) || (uVar9 != 0));
    }
    do {
      if (*(long *)(pQVar14 + 0x10) - 1U == uVar15) {
        pQVar14 = (QObject *)0x0;
        uVar15 = 0;
        break;
      }
      uVar15 = uVar15 + 1;
    } while (*(char *)((ulong)((uint)uVar15 & 0x7f) +
                      (uVar15 >> 7) * 0x90 + *(long *)(pQVar14 + 0x20)) == -1);
  } while ((pQVar14 != (QObject *)0x0) || (uVar15 != 0));
LAB_002d723e:
  QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::~QHash
            ((QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)&local_60.wp.value);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGestureManager::getGestureTargets(const QSet<QGesture*> &gestures,
    QHash<QWidget *, QList<QGesture *> > *conflicts,
    QHash<QWidget *, QList<QGesture *> > *normal)
{
    typedef QHash<Qt::GestureType, QHash<QWidget *, QGesture *> > GestureByTypes;
    GestureByTypes gestureByTypes;

    // sort gestures by types
    for (QGesture *gesture : gestures) {
        QWidget *receiver = m_gestureTargets.value(gesture, nullptr);
        Q_ASSERT(receiver);
        if (receiver)
            gestureByTypes[gesture->gestureType()].insert(receiver, gesture);
    }

    // for each gesture type
    for (GestureByTypes::const_iterator git = gestureByTypes.cbegin(), gend = gestureByTypes.cend(); git != gend; ++git) {
        const QHash<QWidget *, QGesture *> &gestures = git.value();
        for (QHash<QWidget *, QGesture *>::const_iterator wit = gestures.cbegin(), wend = gestures.cend(); wit != wend; ++wit) {
            QWidget *widget = wit.key();
            QWidget *w = widget->parentWidget();
            while (w) {
                QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator it
                        = w->d_func()->gestureContext.constFind(git.key());
                if (it != w->d_func()->gestureContext.constEnd()) {
                    // i.e. 'w' listens to gesture 'type'
                    if (!(it.value() & Qt::DontStartGestureOnChildren) && w != widget) {
                        // conflicting gesture!
                        (*conflicts)[widget].append(wit.value());
                        break;
                    }
                }
                if (w->isWindow()) {
                    w = nullptr;
                    break;
                }
                w = w->parentWidget();
            }
            if (!w)
                (*normal)[widget].append(wit.value());
        }
    }
}